

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zhash.c
# Opt level: O2

int zhash_get_volatile(zhash_t *zh,void *key,void *out_value)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = (*zh->hash)(key);
  uVar3 = zh->nentries - 1;
  while( true ) {
    uVar3 = uVar3 & uVar1;
    uVar1 = zh->entrysz * uVar3;
    if (zh->entries[uVar1] == '\0') {
      return 0;
    }
    iVar2 = (*zh->equals)(key,zh->entries + (uVar1 + 1));
    if (iVar2 != 0) break;
    uVar3 = uVar3 + 1;
    uVar1 = zh->nentries - 1;
  }
  *(char **)out_value = zh->entries + (ulong)(uVar3 * zh->entrysz + 1) + zh->keysz;
  return 1;
}

Assistant:

int zhash_get_volatile(const zhash_t *zh, const void *key, void *out_value)
{
    uint32_t code = zh->hash(key);
    uint32_t entry_idx = code & (zh->nentries - 1);

    while (zh->entries[entry_idx * zh->entrysz]) {
        void *this_key = &zh->entries[entry_idx * zh->entrysz + 1];
        if (zh->equals(key, this_key)) {
            *((void**) out_value) = &zh->entries[entry_idx * zh->entrysz + 1 + zh->keysz];
            return 1;
        }

        entry_idx = (entry_idx + 1) & (zh->nentries - 1);
    }

    return 0;
}